

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateInnerProductLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  bool bVar1;
  undefined1 *puVar2;
  Result *_result;
  undefined1 *puVar3;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)this_00);
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"InnerProduct",(allocator<char> *)&local_68);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_48,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_48);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"InnerProduct",&local_69);
        validateRankCount(__return_storage_ptr__,layer,&local_68,1,5,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_68);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      if (layer->_oneof_case_[0] == 0x8c) {
        puVar2 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar2 = Specification::_InnerProductLayerParams_default_instance_;
      }
      if (((InnerProductLayerParams *)puVar2)->int8dynamicquantize_ == true) {
        puVar3 = (undefined1 *)(((ActivationParams *)puVar2)->NonlinearityType_).linear_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"InnerProduct",&local_69);
        if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
          puVar3 = Specification::_WeightParams_default_instance_;
        }
        validateInt8Requirements
                  (__return_storage_ptr__,(WeightParams *)puVar3,&local_68,
                   (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::__cxx11::string::~string((string *)&local_68);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      puVar3 = (undefined1 *)(((ActivationParams *)puVar2)->NonlinearityType_).linear_;
      if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
        puVar3 = Specification::_WeightParams_default_instance_;
      }
      puVar2 = (undefined1 *)((InnerProductLayerParams *)puVar2)->bias_;
      if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
        puVar2 = Specification::_WeightParams_default_instance_;
      }
      validateInnerProductWeightsBias
                (__return_storage_ptr__,layer,(WeightParams *)puVar3,(WeightParams *)puVar2);
      bVar1 = Result::good(__return_storage_ptr__);
      if (bVar1) {
        std::__cxx11::string::~string((string *)this_00);
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateInnerProductLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "InnerProduct", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "InnerProduct", 1, 5, blobNameToRank));
    }

    const auto& params = layer.innerproduct();
    if (params.int8dynamicquantize()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInt8Requirements(params.weights(), "InnerProduct", layer.name()));
    }

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInnerProductWeightsBias(layer, params.weights(), params.bias()));
    return Result();
}